

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract_avx2.c
# Opt level: O0

void subtract_block_64xn_avx2
               (int rows,int16_t *diff_ptr,ptrdiff_t diff_stride,uint8_t *src_ptr,
               ptrdiff_t src_stride,uint8_t *pred_ptr,ptrdiff_t pred_stride)

{
  int in_EDI;
  int32_t j;
  uint8_t *in_stack_00000068;
  uint8_t *in_stack_00000070;
  int16_t *in_stack_00000078;
  undefined4 local_34;
  
  for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
    subtract32_avx2(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    subtract32_avx2(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

static inline void subtract_block_64xn_avx2(
    int rows, int16_t *diff_ptr, ptrdiff_t diff_stride, const uint8_t *src_ptr,
    ptrdiff_t src_stride, const uint8_t *pred_ptr, ptrdiff_t pred_stride) {
  for (int32_t j = 0; j < rows; ++j) {
    subtract32_avx2(diff_ptr, src_ptr, pred_ptr);
    subtract32_avx2(diff_ptr + 32, src_ptr + 32, pred_ptr + 32);
    src_ptr += src_stride;
    pred_ptr += pred_stride;
    diff_ptr += diff_stride;
  }
}